

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_buffer.cc
# Opt level: O3

void __thiscall webrtc::AudioBuffer::~AudioBuffer(AudioBuffer *this)

{
  ChannelBuffer<float> *__ptr;
  IFChannelBuffer *pIVar1;
  ChannelBuffer<short> *pCVar2;
  SplittingFilter *__ptr_00;
  
  this->_vptr_AudioBuffer = (_func_int **)&PTR__AudioBuffer_001d1298;
  std::
  vector<std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>,_std::allocator<std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>_>_>
  ::~vector(&this->output_resamplers_);
  std::
  vector<std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>,_std::allocator<std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>_>_>
  ::~vector(&this->input_resamplers_);
  __ptr = (this->process_buffer_)._M_t.
          super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
          .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl;
  if (__ptr != (ChannelBuffer<float> *)0x0) {
    std::default_delete<webrtc::ChannelBuffer<float>_>::operator()
              ((default_delete<webrtc::ChannelBuffer<float>_> *)&this->process_buffer_,__ptr);
  }
  (this->process_buffer_)._M_t.
  super___uniq_ptr_impl<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::ChannelBuffer<float>_*,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
  .super__Head_base<0UL,_webrtc::ChannelBuffer<float>_*,_false>._M_head_impl =
       (ChannelBuffer<float> *)0x0;
  pIVar1 = (this->output_buffer_)._M_t.
           super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>
           .super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl;
  if (pIVar1 != (IFChannelBuffer *)0x0) {
    std::default_delete<webrtc::IFChannelBuffer>::operator()
              ((default_delete<webrtc::IFChannelBuffer> *)&this->output_buffer_,pIVar1);
  }
  (this->output_buffer_)._M_t.
  super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>._M_t
  .super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>.
  super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl = (IFChannelBuffer *)0x0;
  pIVar1 = (this->input_buffer_)._M_t.
           super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>
           .super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl;
  if (pIVar1 != (IFChannelBuffer *)0x0) {
    std::default_delete<webrtc::IFChannelBuffer>::operator()
              ((default_delete<webrtc::IFChannelBuffer> *)&this->input_buffer_,pIVar1);
  }
  (this->input_buffer_)._M_t.
  super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>._M_t
  .super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>.
  super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl = (IFChannelBuffer *)0x0;
  pCVar2 = (this->low_pass_reference_channels_)._M_t.
           super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
           .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>._M_head_impl;
  if (pCVar2 != (ChannelBuffer<short> *)0x0) {
    std::default_delete<webrtc::ChannelBuffer<short>_>::operator()
              ((default_delete<webrtc::ChannelBuffer<short>_> *)&this->low_pass_reference_channels_,
               pCVar2);
  }
  (this->low_pass_reference_channels_)._M_t.
  super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
  .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>._M_head_impl =
       (ChannelBuffer<short> *)0x0;
  pCVar2 = (this->mixed_low_pass_channels_)._M_t.
           super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
           .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>._M_head_impl;
  if (pCVar2 != (ChannelBuffer<short> *)0x0) {
    std::default_delete<webrtc::ChannelBuffer<short>_>::operator()
              ((default_delete<webrtc::ChannelBuffer<short>_> *)&this->mixed_low_pass_channels_,
               pCVar2);
  }
  (this->mixed_low_pass_channels_)._M_t.
  super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
  .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>._M_head_impl =
       (ChannelBuffer<short> *)0x0;
  __ptr_00 = (this->splitting_filter_)._M_t.
             super___uniq_ptr_impl<webrtc::SplittingFilter,_std::default_delete<webrtc::SplittingFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_webrtc::SplittingFilter_*,_std::default_delete<webrtc::SplittingFilter>_>
             .super__Head_base<0UL,_webrtc::SplittingFilter_*,_false>._M_head_impl;
  if (__ptr_00 != (SplittingFilter *)0x0) {
    std::default_delete<webrtc::SplittingFilter>::operator()
              ((default_delete<webrtc::SplittingFilter> *)&this->splitting_filter_,__ptr_00);
  }
  (this->splitting_filter_)._M_t.
  super___uniq_ptr_impl<webrtc::SplittingFilter,_std::default_delete<webrtc::SplittingFilter>_>._M_t
  .super__Tuple_impl<0UL,_webrtc::SplittingFilter_*,_std::default_delete<webrtc::SplittingFilter>_>.
  super__Head_base<0UL,_webrtc::SplittingFilter_*,_false>._M_head_impl = (SplittingFilter *)0x0;
  pIVar1 = (this->split_data_)._M_t.
           super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>
           .super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl;
  if (pIVar1 != (IFChannelBuffer *)0x0) {
    std::default_delete<webrtc::IFChannelBuffer>::operator()
              ((default_delete<webrtc::IFChannelBuffer> *)&this->split_data_,pIVar1);
  }
  (this->split_data_)._M_t.
  super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>._M_t
  .super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>.
  super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl = (IFChannelBuffer *)0x0;
  pIVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>
           .super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl;
  if (pIVar1 != (IFChannelBuffer *)0x0) {
    std::default_delete<webrtc::IFChannelBuffer>::operator()
              ((default_delete<webrtc::IFChannelBuffer> *)&this->data_,pIVar1);
  }
  (this->data_)._M_t.
  super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>._M_t
  .super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>.
  super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl = (IFChannelBuffer *)0x0;
  return;
}

Assistant:

AudioBuffer::~AudioBuffer() {}